

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CampaignReader.cpp
# Opt level: O2

void __thiscall adios2::core::engine::CampaignReader::EndStep(CampaignReader *this)

{
  ostream *poVar1;
  
  if (this->m_NeedPerformGets == true) {
    PerformGets(this);
  }
  if (1 < (this->m_Options).verbose) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Campaign Reader ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ReaderRank);
    std::operator<<(poVar1,"   EndStep()\n");
    return;
  }
  return;
}

Assistant:

void CampaignReader::EndStep()
{
    // EndStep should call PerformGets() if there are unserved GetDeferred()
    // requests
    if (m_NeedPerformGets)
    {
        PerformGets();
    }

    if (m_Options.verbose > 1)
    {
        std::cout << "Campaign Reader " << m_ReaderRank << "   EndStep()\n";
    }
}